

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * indexInAffinityOk(Parse *pParse,WhereTerm *pTerm,u8 idxaff)

{
  long lVar1;
  int iVar2;
  CollSeq *pCVar3;
  long *in_RSI;
  long in_FS_OFFSET;
  CollSeq *pRet;
  int iField;
  Expr *pX;
  Expr inexpr;
  Parse *in_stack_ffffffffffffff68;
  char *local_90;
  char *local_58;
  undefined1 local_50 [4];
  undefined4 local_4c;
  undefined8 local_40;
  undefined8 local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *in_RSI;
  memset(local_50,0xaa,0x48);
  iVar2 = sqlite3ExprIsVector((Expr *)0x2031c7);
  if (iVar2 != 0) {
    iVar2 = *(int *)((long)in_RSI + 0x24) + -1;
    local_4c = 0;
    local_50[0] = 0x36;
    local_40 = *(undefined8 *)(*(long *)(*(long *)(lVar1 + 0x10) + 0x20) + 8 + (long)iVar2 * 0x18);
    local_38 = *(undefined8 *)(*(long *)(*(long *)(lVar1 + 0x20) + 0x20) + 8 + (long)iVar2 * 0x18);
  }
  iVar2 = sqlite3IndexAffinityOk((Expr *)in_stack_ffffffffffffff68,'\0');
  if (iVar2 == 0) {
    local_58 = (char *)0x0;
  }
  else {
    pCVar3 = sqlite3ExprCompareCollSeq(in_stack_ffffffffffffff68,(Expr *)0x20325f);
    if (pCVar3 == (CollSeq *)0x0) {
      local_90 = "BINARY";
    }
    else {
      local_90 = pCVar3->zName;
    }
    local_58 = local_90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_58;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE const char *indexInAffinityOk(
  Parse *pParse,
  WhereTerm *pTerm,
  u8 idxaff
){
  Expr *pX = pTerm->pExpr;
  Expr inexpr;

  assert( pTerm->eOperator & WO_IN );

  if( sqlite3ExprIsVector(pX->pLeft) ){
    int iField = pTerm->u.x.iField - 1;
    inexpr.flags = 0;
    inexpr.op = TK_EQ;
    inexpr.pLeft = pX->pLeft->x.pList->a[iField].pExpr;
    assert( ExprUseXSelect(pX) );
    inexpr.pRight = pX->x.pSelect->pEList->a[iField].pExpr;
    pX = &inexpr;
  }

  if( sqlite3IndexAffinityOk(pX, idxaff) ){
    CollSeq *pRet = sqlite3ExprCompareCollSeq(pParse, pX);
    return pRet ? pRet->zName : sqlite3StrBINARY;
  }
  return 0;
}